

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

void __thiscall TypeFactory::clearCache(TypeFactory *this)

{
  memset(this->typecache,0,0x240);
  this->typecache10 = (Datatype *)0x0;
  this->typecache16 = (Datatype *)0x0;
  this->type_nochar = (Datatype *)0x0;
  return;
}

Assistant:

void TypeFactory::clearCache(void)

{
  int4 i,j;
  for(i=0;i<9;++i)
    for(j=0;j<8;++j)
      typecache[i][j] = (Datatype *)0;
  typecache10 = (Datatype *)0;
  typecache16 = (Datatype *)0;
  type_nochar = (Datatype *)0;
}